

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# np_nes_fds.c
# Opt level: O3

bool NES_FDS_Write(void *chip,UINT16 adr,UINT8 val)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined6 in_register_00000032;
  
  iVar3 = (int)CONCAT62(in_register_00000032,adr);
  if (iVar3 == 0x4023) {
    *(byte *)((long)chip + 0x2c) = val >> 1 & 1;
    goto LAB_00163fd3;
  }
  if ((ushort)(adr + 0xbf75) < 0xffb5) {
    return false;
  }
  if (*(char *)((long)chip + 0x2c) == '\0') {
    return false;
  }
  if (adr < 0x4080) {
    if (*(char *)((long)chip + 0x248) == '\0') {
      return true;
    }
    *(uint *)((long)chip + (ulong)(iVar3 - 0x4040) * 4 + 0x138) = (uint)(val & 0x3f);
    return true;
  }
  bVar1 = false;
  switch(adr & 0xff) {
  case 0x80:
    *(UINT8 *)((long)chip + 599) = val >> 7;
    *(byte *)((long)chip + 0x255) = val >> 6 & 1;
    *(undefined4 *)((long)chip + 0x25c) = 0;
    *(uint *)((long)chip + 0x264) = (uint)(val & 0x3f);
    bVar1 = true;
    if ((char)val < '\0') {
      *(uint *)((long)chip + 0x26c) = (uint)(val & 0x3f);
      return bVar1;
    }
    break;
  case 0x82:
    *(uint *)((long)chip + 0x23c) = (uint)val | *(uint *)((long)chip + 0x23c) & 0xf00;
    goto LAB_00163fd3;
  case 0x83:
    *(uint *)((long)chip + 0x23c) = (val & 0xf) << 8 | (uint)*(byte *)((long)chip + 0x23c);
    *(UINT8 *)((long)chip + 0x249) = val >> 7;
    *(byte *)((long)chip + 0x24a) = val >> 6 & 1;
    if ((char)val < '\0') {
      *(undefined4 *)((long)chip + 0x244) = 0;
    }
    bVar1 = true;
    if ((val >> 6 & 1) != 0) {
      *(undefined8 *)((long)chip + 600) = 0;
      return bVar1;
    }
    break;
  case 0x84:
    *(UINT8 *)((long)chip + 0x256) = val >> 7;
    *(byte *)((long)chip + 0x254) = val >> 6 & 1;
    *(undefined4 *)((long)chip + 600) = 0;
    *(uint *)((long)chip + 0x260) = (uint)(val & 0x3f);
    bVar1 = true;
    if ((char)val < '\0') {
      *(uint *)((long)chip + 0x268) = (uint)(val & 0x3f);
      return bVar1;
    }
    break;
  case 0x85:
    *(uint *)((long)chip + 0x24c) = (uint)(val & 0x7f);
    bVar1 = true;
    if (*(int *)((long)chip + 0x24) != 0) {
      *(int *)((long)chip + 0x240) = *(int *)((long)chip + 0x250) << 0x10;
      return bVar1;
    }
    break;
  case 0x86:
    *(uint *)((long)chip + 0x238) = (uint)val | *(uint *)((long)chip + 0x238) & 0xf00;
    goto LAB_00163fd3;
  case 0x87:
    *(uint *)((long)chip + 0x238) = (val & 0xf) << 8 | (uint)*(byte *)((long)chip + 0x238);
    *(UINT8 *)((long)chip + 0x24b) = val >> 7;
    bVar1 = true;
    if ((char)val < '\0') {
      *(uint *)((long)chip + 0x240) = *(uint *)((long)chip + 0x240) & 0x3f0000;
      return bVar1;
    }
    break;
  case 0x88:
    bVar1 = true;
    if (*(char *)((long)chip + 0x24b) != '\0') {
      uVar2 = *(uint *)((long)chip + 0x240);
      *(uint *)((long)chip + (ulong)(uVar2 >> 0xe & 0xfc) + 0x38) = (uint)(val & 0x7f);
      *(uint *)((long)chip + (ulong)(uVar2 + 0x10000 >> 0xe & 0xfc) + 0x38) = (uint)(val & 0x7f);
      uVar2 = uVar2 + 0x20000 & 0x3fffff;
      *(uint *)((long)chip + 0x240) = uVar2;
      *(uint *)((long)chip + 0x250) = uVar2 >> 0x10;
      return bVar1;
    }
    break;
  case 0x89:
    *(UINT8 *)((long)chip + 0x248) = val >> 7;
    *(byte *)((long)chip + 0x2d) = val & 3;
    goto LAB_00163fd3;
  case 0x8a:
    *(uint *)((long)chip + 0x270) = (uint)val;
    *(undefined8 *)((long)chip + 600) = 0;
LAB_00163fd3:
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool NES_FDS_Write(void* chip, UINT16 adr, UINT8 val)
{
	NES_FDS* fds = (NES_FDS*)chip;

	// $4023 master I/O enable/disable
	if (adr == 0x4023)
	{
		fds->master_io = ((val & 2) != 0);
		return true;
	}

	if (!fds->master_io)
		return false;
	if (adr < 0x4040 || adr > 0x408A)
		return false;

	if (adr < 0x4080)	// $4040-407F wave table write
	{
		if (fds->wav_write)
			fds->wave[TWAV][adr - 0x4040] = val & 0x3F;
		return true;
	}

	switch (adr & 0x00FF)
	{
	case 0x80:	// $4080 volume envelope
		fds->env_disable[EVOL] = ((val & 0x80) != 0);
		fds->env_mode[EVOL] = ((val & 0x40) != 0);
		fds->env_timer[EVOL] = 0;
		fds->env_speed[EVOL] = val & 0x3F;
		if (fds->env_disable[EVOL])
			fds->env_out[EVOL] = fds->env_speed[EVOL];
		return true;
	case 0x81:	// $4081 ---
		return false;
	case 0x82:	// $4082 wave frequency low
		fds->freq[TWAV] = (fds->freq[TWAV] & 0xF00) | val;
		return true;
	case 0x83:	// $4083 wave frequency high / enables
		fds->freq[TWAV] = (fds->freq[TWAV] & 0x0FF) | ((val & 0x0F) << 8);
		fds->wav_halt = ((val & 0x80) != 0);
		fds->env_halt = ((val & 0x40) != 0);
		if (fds->wav_halt)
			fds->phase[TWAV] = 0;
		if (fds->env_halt)
		{
			fds->env_timer[EMOD] = 0;
			fds->env_timer[EVOL] = 0;
		}
		return true;
	case 0x84:	// $4084 mod envelope
		fds->env_disable[EMOD] = ((val & 0x80) != 0);
		fds->env_mode[EMOD] = ((val & 0x40) != 0);
		fds->env_timer[EMOD] = 0;
		fds->env_speed[EMOD] = val & 0x3F;
		if (fds->env_disable[EMOD])
			fds->env_out[EMOD] = fds->env_speed[EMOD];
		return true;
	case 0x85:	// $4085 mod position
		fds->mod_pos = val & 0x7F;
		// not hardware accurate, but prevents detune due to cycle inaccuracies
		// (notably in Bio Miracle Bokutte Upa)
		if (fds->option[OPT_4085_RESET])
			fds->phase[TMOD] = fds->mod_write_pos << 16;
		return true;
	case 0x86:	// $4086 mod frequency low
		fds->freq[TMOD] = (fds->freq[TMOD] & 0xF00) | val;
		return true;
	case 0x87:	// $4087 mod frequency high / enable
		fds->freq[TMOD] = (fds->freq[TMOD] & 0x0FF) | ((val & 0x0F) << 8);
		fds->mod_halt = ((val & 0x80) != 0);
		if (fds->mod_halt)
			fds->phase[TMOD] = fds->phase[TMOD] & 0x3F0000;	// reset accumulator phase
		return true;
	case 0x88:	// $4088 mod table write
		if (fds->mod_halt)
		{
			// writes to current playback position (there is no direct way to set phase)
			fds->wave[TMOD][(fds->phase[TMOD] >> 16) & 0x3F] = val & 0x7F;
			fds->phase[TMOD] = (fds->phase[TMOD] + 0x010000) & 0x3FFFFF;
			fds->wave[TMOD][(fds->phase[TMOD] >> 16) & 0x3F] = val & 0x7F;
			fds->phase[TMOD] = (fds->phase[TMOD] + 0x010000) & 0x3FFFFF;
			fds->mod_write_pos = fds->phase[TMOD] >> 16;	// used by OPT_4085_RESET
		}
		return true;
	case 0x89:	// $4089 wave write enable, master volume
		fds->wav_write = ((val & 0x80) != 0);
		fds->master_vol = val & 0x03;
		return true;
	case 0x8A:	// $408A envelope speed
		fds->master_env_speed = val;
		// haven't tested whether this register resets phase on hardware,
		// but this ensures my inplementation won't spam envelope clocks
		// if this value suddenly goes low.
		fds->env_timer[EMOD] = 0;
		fds->env_timer[EVOL] = 0;
		return true;
	default:
		return false;
	}
	return false;
}